

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

char * __thiscall
cmNinjaNormalTargetGenerator::GetVisibleTypeName(cmNinjaNormalTargetGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *pcVar3;
  cmNinjaNormalTargetGenerator *this_local;
  
  pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  TVar2 = cmGeneratorTarget::GetType(pcVar3);
  switch(TVar2) {
  case EXECUTABLE:
    this_local = (cmNinjaNormalTargetGenerator *)0xfca4c8;
    break;
  case STATIC_LIBRARY:
    this_local = (cmNinjaNormalTargetGenerator *)0xfd3e26;
    break;
  case SHARED_LIBRARY:
    this_local = (cmNinjaNormalTargetGenerator *)0xfca4d4;
    break;
  case MODULE_LIBRARY:
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    bVar1 = cmGeneratorTarget::IsCFBundleOnApple(pcVar3);
    if (bVar1) {
      this_local = (cmNinjaNormalTargetGenerator *)anon_var_dwarf_83a0ab;
    }
    else {
      this_local = (cmNinjaNormalTargetGenerator *)0xfb7f5d;
    }
    break;
  default:
    this_local = (cmNinjaNormalTargetGenerator *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* cmNinjaNormalTargetGenerator::GetVisibleTypeName() const
{
  switch (this->GetGeneratorTarget()->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      return "static library";
    case cmStateEnums::SHARED_LIBRARY:
      return "shared library";
    case cmStateEnums::MODULE_LIBRARY:
      if (this->GetGeneratorTarget()->IsCFBundleOnApple()) {
        return "CFBundle shared module";
      } else {
        return "shared module";
      }
    case cmStateEnums::EXECUTABLE:
      return "executable";
    default:
      return nullptr;
  }
}